

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fraction.cpp
# Opt level: O0

Fraction * __thiscall
Fraction::operator+(Fraction *__return_storage_ptr__,Fraction *this,Fraction *b)

{
  BigInteger local_f8;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  undefined1 local_61;
  undefined1 local_60 [8];
  Fraction a;
  Fraction *b_local;
  Fraction *this_local;
  Fraction *c;
  
  a.denominator._24_8_ = b;
  Fraction((Fraction *)local_60,this);
  local_61 = 0;
  Fraction(__return_storage_ptr__);
  BigIntegerLibrary::BigInteger::operator*
            (&local_98,(BigInteger *)&a.numerator.isNegative,
             (BigInteger *)(a.denominator._24_8_ + 0x20));
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->denominator,&local_98);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_98);
  BigIntegerLibrary::BigInteger::operator*
            (&local_d8,(BigInteger *)local_60,(BigInteger *)(a.denominator._24_8_ + 0x20));
  BigIntegerLibrary::BigInteger::operator*
            (&local_f8,(BigInteger *)a.denominator._24_8_,(BigInteger *)&a.numerator.isNegative);
  BigIntegerLibrary::BigInteger::operator+(&local_b8,&local_d8,&local_f8);
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->numerator,&local_b8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_b8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_f8);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_d8);
  reduction(__return_storage_ptr__);
  local_61 = 1;
  ~Fraction((Fraction *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Fraction Fraction::operator+(const Fraction& b) const { // a/b + c/d = (ad+cb)/bd
    Fraction a = *this;
    Fraction c;
    c.denominator = a.denominator * b.denominator;
    c.numerator = a.numerator * b.denominator + b.numerator * a.denominator;
    reduction(c);
    return c;
}